

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_start(nn_fsm *self)

{
  int iVar1;
  nn_fsm *self_00;
  
  self_00 = self;
  if (self->state == 1) {
    self_00 = (nn_fsm *)&(self->stopped).item;
    iVar1 = nn_queue_item_isinqueue((nn_queue_item *)self_00);
    if (iVar1 == 0) {
      (*self->fn)(self,-2,-2,(void *)0x0);
      self->state = 2;
      return;
    }
  }
  nn_fsm_start_cold_1();
  if (self_00->state == 2) {
    self_00->state = 3;
    (*self_00->shutdown_fn)(self_00,-2,-3,(void *)0x0);
    return;
  }
  return;
}

Assistant:

void nn_fsm_start (struct nn_fsm *self)
{
    nn_assert (nn_fsm_isidle (self));
    self->fn (self, NN_FSM_ACTION, NN_FSM_START, NULL);
    self->state = NN_FSM_STATE_ACTIVE;
}